

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadBasicNodeInfo_Ascii
          (COBImporter *this,Node *msh,LineSplitter *splitter,ChunkInfo *param_3)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar1;
  char *__s;
  LineSplitter *pLVar2;
  float *pfVar3;
  uint x;
  long lVar4;
  uint y;
  uint p_iIndex;
  allocator<char> local_55;
  float local_54;
  char *s;
  
  do {
    if (*(int *)&splitter->mStream->end == *(int *)&splitter->mStream->current) {
      return;
    }
    bVar1 = LineSplitter::match_start(splitter,"Name");
    if (bVar1) {
      __s = LineSplitter::operator[](splitter,1);
      std::__cxx11::string::string<std::allocator<char>>((string *)&s,__s,&local_55);
      std::__cxx11::string::operator=((string *)&msh->name,(string *)&s);
      std::__cxx11::string::~string((string *)&s);
      __first._M_current = (msh->name)._M_dataplus._M_p;
      s = (char *)CONCAT71(s._1_7_,0x2c);
      local_55 = (allocator<char>)0x5f;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__first._M_current + (msh->name)._M_string_length),(char *)&s,
                 (char *)&local_55);
    }
    else {
      bVar1 = LineSplitter::match_start(splitter,"Transform");
      if (bVar1) {
        p_iIndex = 0;
        while( true ) {
          if (p_iIndex == 4) {
            return;
          }
          pLVar2 = LineSplitter::operator++(splitter);
          if (*(int *)&pLVar2->mStream->end == *(int *)&pLVar2->mStream->current) break;
          s = (splitter->mCur)._M_dataplus._M_p;
          for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
            SkipSpaces<char>(&s);
            local_54 = fast_atof(&s);
            pfVar3 = aiMatrix4x4t<float>::operator[](&msh->transform,p_iIndex);
            pfVar3[lVar4] = local_54;
          }
          p_iIndex = p_iIndex + 1;
        }
        return;
      }
    }
    LineSplitter::operator++(splitter);
  } while( true );
}

Assistant:

void COBImporter::ReadBasicNodeInfo_Ascii(Node& msh, LineSplitter& splitter, const ChunkInfo& /*nfo*/)
{
    for(;splitter;++splitter) {
        if (splitter.match_start("Name")) {
            msh.name = std::string(splitter[1]);

            // make nice names by merging the dupe count
            std::replace(msh.name.begin(),msh.name.end(),
                ',','_');
        }
        else if (splitter.match_start("Transform")) {
            for(unsigned int y = 0; y < 4 && ++splitter; ++y) {
                const char* s = splitter->c_str();
                for(unsigned int x = 0; x < 4; ++x) {
                    SkipSpaces(&s);
                    msh.transform[y][x] = fast_atof(&s);
                }
            }
            // we need the transform chunk, so we won't return until we have it.
            return;
        }
    }
}